

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O2

int main(void)

{
  cio_error cVar1;
  cio_address_family family;
  __sighandler_t p_Var2;
  cio_inet_address *inet_address;
  uint uVar3;
  cio_server_socket server_socket;
  cio_socket_address endpoint;
  
  p_Var2 = signal(0xf,sighandler);
  uVar3 = 0xffffffff;
  if (p_Var2 != (__sighandler_t)0xffffffffffffffff) {
    p_Var2 = signal(2,sighandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,(__sighandler_t)0x0);
    }
    else {
      inet_address = cio_get_inet_address_any4();
      cVar1 = cio_init_inet_socket_address(&endpoint,inet_address,0x3039);
      if (cVar1 == CIO_SUCCESS) {
        cVar1 = cio_eventloop_init(&loop);
        if (cVar1 == CIO_SUCCESS) {
          family = cio_socket_address_get_family(&endpoint);
          cVar1 = cio_server_socket_init
                            (&server_socket,&loop,5,family,alloc_echo_client,free_echo_client,
                             1000000000,(cio_server_socket_close_hook_t)0x0);
          if (cVar1 == CIO_SUCCESS) {
            uVar3 = 1;
            cVar1 = cio_server_socket_set_tcp_fast_open(&server_socket,true);
            if (cVar1 == CIO_SUCCESS) {
              uVar3 = 1;
              cVar1 = cio_server_socket_set_reuse_address(&server_socket,true);
              if (((cVar1 == CIO_SUCCESS) &&
                  (cVar1 = cio_server_socket_bind(&server_socket,&endpoint), cVar1 == CIO_SUCCESS))
                 && (cVar1 = cio_server_socket_accept(&server_socket,handle_accept,(void *)0x0),
                    cVar1 == CIO_SUCCESS)) {
                cVar1 = cio_eventloop_run(&loop);
                uVar3 = (uint)(cVar1 != CIO_SUCCESS);
              }
            }
            else {
              fwrite("could not set TCP FASTOPEN for server socket!\n",0x2e,1,_stderr);
            }
            cio_server_socket_close(&server_socket);
          }
          else {
            uVar3 = 1;
          }
          cio_eventloop_destroy(&loop);
        }
        else {
          uVar3 = 1;
        }
      }
      else {
        uVar3 = 0xffffffff;
      }
    }
  }
  return uVar3;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	struct cio_socket_address endpoint;
	enum cio_error err = cio_init_inet_socket_address(&endpoint, cio_get_inet_address_any4(), SERVERSOCKET_LISTEN_PORT);
	if (err != CIO_SUCCESS) {
		return -1;
	}

	err = cio_eventloop_init(&loop);
	if (err != CIO_SUCCESS) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = cio_server_socket_init(&server_socket, &loop, SERVERSOCKET_BACKLOG, cio_socket_address_get_family(&endpoint), alloc_echo_client, free_echo_client, CLOSE_TIMEOUT_NS, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_server_socket_set_tcp_fast_open(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set TCP FASTOPEN for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_set_reuse_address(&server_socket, true);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_bind(&server_socket, &endpoint);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_accept(&server_socket, handle_accept, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}